

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

void wasm_val_copy(wasm_val_t *out,wasm_val_t *in)

{
  wasm_ref_t *pwVar1;
  Store *this;
  anon_union_8_5_30786955_for_of aVar2;
  undefined7 uVar3;
  FILE *pFVar4;
  undefined8 *puVar5;
  Index IVar6;
  TypedValue *tv;
  TypedValue *tv_00;
  string local_68;
  TypedValue local_48;
  
  pFVar4 = _stderr;
  ToWabtValue(&local_48,in);
  wabt::interp::TypedValueToString_abi_cxx11_(&local_68,(interp *)&local_48,tv);
  fprintf(pFVar4,"CAPI: [%s] %s\n","wasm_val_copy",local_68._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((char)in->kind < '\0') {
    out->kind = in->kind;
    pwVar1 = (in->of).ref;
    if (pwVar1 == (wasm_ref_t *)0x0) {
      puVar5 = (undefined8 *)0x0;
    }
    else {
      puVar5 = (undefined8 *)operator_new(0x18);
      *puVar5 = (pwVar1->I).obj_;
      this = (pwVar1->I).store_;
      puVar5[1] = this;
      if (this == (Store *)0x0) {
        IVar6 = 0;
      }
      else {
        IVar6 = wabt::interp::Store::CopyRoot(this,(pwVar1->I).root_index_);
      }
      puVar5[2] = IVar6;
    }
    (out->of).i64 = (int64_t)puVar5;
  }
  else {
    uVar3 = *(undefined7 *)&in->field_0x1;
    aVar2 = in->of;
    out->kind = in->kind;
    *(undefined7 *)&out->field_0x1 = uVar3;
    out->of = aVar2;
  }
  pFVar4 = _stderr;
  ToWabtValue(&local_48,out);
  wabt::interp::TypedValueToString_abi_cxx11_(&local_68,(interp *)&local_48,tv_00);
  fprintf(pFVar4,"CAPI: [%s] -> %p %s\n","wasm_val_copy",out,local_68._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void wasm_val_copy(own wasm_val_t* out, const wasm_val_t* in) {
  TRACE("%s", TypedValueToString(ToWabtValue(*in)).c_str());
  if (wasm_valkind_is_ref(in->kind)) {
    out->kind = in->kind;
    out->of.ref = in->of.ref ? new wasm_ref_t{*in->of.ref} : nullptr;
  } else {
    *out = *in;
  }
  TRACE("-> %p %s", out, TypedValueToString(ToWabtValue(*out)).c_str());
}